

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::Y_formatter<spdlog::details::scoped_padder>::format
          (Y_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  scoped_padder p;
  scoped_padder sStack_58;
  format_int local_30;
  
  scoped_padder::scoped_padder(&sStack_58,4,&(this->super_flag_formatter).padinfo_,dest);
  local_30.str_ = fmt::v8::format_int::format_signed<int>(&local_30,tm_time->tm_year + 0x76c);
  fmt::v8::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,local_30.str_,local_30.buffer_ + 0x15);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 4;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }